

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O2

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstComparisonCondition> *cExpr,int priority)

{
  int iVar1;
  AstExpr *pAVar2;
  mapped_type *pmVar3;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *__r;
  int in_R8D;
  Type TVar4;
  shared_ptr<nigel::AstReturning> sVar5;
  AstExpr local_98;
  undefined1 local_68 [16];
  shared_ptr<nigel::AstExpr> clTerm;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_98.token.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(in_register_0000000c,priority);
  clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super_enable_shared_from_this<nigel::AstExpr>._M_weak_this.
  super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(currLVal + 2);
  local_98.token.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal;
  do {
    TVar4 = (((cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr)->super_AstCondition).super_AstExpr.type;
    if (TVar4 == combinationCondition) {
      AstExpr::as<nigel::AstCombinationCondition>(&local_98);
      pmVar3 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)local_98.super_enable_shared_from_this<nigel::AstExpr>._M_weak_this.
                               super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,(key_type *)(local_98._vptr_AstExpr + 10));
      iVar1 = *pmVar3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_98.super_enable_shared_from_this<nigel::AstExpr>);
      if (in_R8D <= iVar1) {
        TVar4 = (((cExpr->
                  super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_AstCondition).super_AstExpr.type;
        goto LAB_0014f890;
      }
      AstExpr::as<nigel::AstCombinationCondition>(&local_98);
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&clTerm,
                 (__shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_98.super_enable_shared_from_this<nigel::AstExpr>);
      AstExpr::as<nigel::AstCombinationCondition>(&local_98);
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)cExpr,
                 (__shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_98._vptr_AstExpr + 8));
    }
    else {
LAB_0014f890:
      if (TVar4 == comparisonCondition) {
        AstExpr::as<nigel::AstComparisonCondition>(&local_98);
        pmVar3 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                               *)local_98.super_enable_shared_from_this<nigel::AstExpr>._M_weak_this
                                 .super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,(key_type *)(local_98._vptr_AstExpr + 10));
        iVar1 = *pmVar3;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_98.super_enable_shared_from_this<nigel::AstExpr>);
        if (in_R8D <= iVar1) {
          TVar4 = (((cExpr->
                    super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_AstCondition).super_AstExpr.type;
          goto LAB_0014f8fe;
        }
        AstExpr::as<nigel::AstComparisonCondition>(&local_98);
        std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&clTerm,
                   (__shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_98.super_enable_shared_from_this<nigel::AstExpr>);
        AstExpr::as<nigel::AstComparisonCondition>(&local_98);
        __r = (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)
              (local_98._vptr_AstExpr + 8);
      }
      else {
LAB_0014f8fe:
        if (TVar4 == term) {
          AstExpr::as<nigel::AstTerm>((AstExpr *)local_68);
          pmVar3 = std::
                   map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                   ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                                 *)local_98.super_enable_shared_from_this<nigel::AstExpr>.
                                   _M_weak_this.
                                   super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi,(key_type *)(local_68._0_8_ + 0x58));
          if (in_R8D <= *pmVar3) goto LAB_0014f931;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
LAB_0014f98e:
          AstExpr::as<nigel::AstTerm>(&local_98);
          std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)&clTerm,
                     (__shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_98.super_enable_shared_from_this<nigel::AstExpr>);
          AstExpr::as<nigel::AstTerm>(&local_98);
          __r = (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)
                (local_98._vptr_AstExpr + 9);
        }
        else {
LAB_0014f931:
          local_98._28_4_ = 0x2d;
          pmVar3 = std::
                   map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                   ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                                 *)local_98.super_enable_shared_from_this<nigel::AstExpr>.
                                   _M_weak_this.
                                   super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi,(key_type *)&local_98.field_0x1c);
          if (*pmVar3 == in_R8D) {
            AstExpr::as<nigel::AstTerm>(&local_98);
            pmVar3 = std::
                     map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                     ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                                   *)local_98.super_enable_shared_from_this<nigel::AstExpr>.
                                     _M_weak_this.
                                     super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi,(key_type *)(local_98._vptr_AstExpr + 0xb));
            iVar1 = *pmVar3;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_98.super_enable_shared_from_this<nigel::AstExpr>);
            if (TVar4 == term) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
            }
            if (iVar1 == in_R8D) goto LAB_0014f98e;
          }
          else if (TVar4 == term) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
          }
          if ((((cExpr->
                super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_AstCondition).super_AstExpr.type != arithmenticCondition) {
            if (clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)
                         (local_98.token.
                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + 0xb),
                         (__shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2> *)
                         local_98.token.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
            else {
              if ((clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  type == combinationCondition) {
                AstExpr::as<nigel::AstCombinationCondition>(&local_98);
                pAVar2 = &local_98;
                std::__shared_ptr<nigel::AstCondition,(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<nigel::AstCondition,(__gnu_cxx::_Lock_policy)2> *)
                           (local_98._vptr_AstExpr + 8),
                           (__shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                            *)local_98.token.
                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              }
              else {
                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_40,
                           &((clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->token).
                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
                BuilderExecutable::generateNotification
                          ((BuilderExecutable *)
                           local_98.token.
                           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,err_comparisonConditionCannotBeThisRValue,
                           (shared_ptr<nigel::Token> *)&local_40);
                pAVar2 = (AstExpr *)&local_40;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &pAVar2->super_enable_shared_from_this<nigel::AstExpr>);
            }
            AstExpr::as<nigel::AstReturning>((AstExpr *)this);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = extraout_RDX._M_pi;
            sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)this;
            return (shared_ptr<nigel::AstReturning>)
                   sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
          }
          AstExpr::as<nigel::AstArithmeticCondition>(&local_98);
          __r = (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)
                (local_98._vptr_AstExpr + 6);
        }
      }
      std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)cExpr,__r);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_98.super_enable_shared_from_this<nigel::AstExpr>);
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstComparisonCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;
		while( true )
		{//Split all possible (unatomic) expressions
			if( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstCombinationCondition>();
				currLVal = currLVal->as<AstCombinationCondition>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::comparisonCondition && opPriority[currLVal->as<AstComparisonCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstComparisonCondition>();
				currLVal = currLVal->as<AstComparisonCondition>()->rVal;
			}
			else if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal->as<AstTerm>();
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::arithmenticCondition )
			{
				currLVal = currLVal->as<AstArithmeticCondition>()->ret;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::combinationCondition ) clTerm->as<AstCombinationCondition>()->rVal = cExpr;
			else generateNotification( NT::err_comparisonConditionCannotBeThisRValue, clTerm->token );
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}